

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::anon_unknown_0::SignCaseInstance::getInputValues
          (SignCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  float fVar2;
  DataType dataType;
  pointer pSVar3;
  void *__s;
  deUint32 dVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  int in_R9D;
  size_t sVar8;
  ulong uVar9;
  float fVar10;
  Random rnd;
  IVec2 intRanges [3];
  Vec2 floatRanges [3];
  deRandom local_78;
  int local_68 [8];
  float local_48 [6];
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -10000.0;
  local_48[3] = 10000.0;
  local_48[4] = -1e+08;
  local_48[5] = 1e+08;
  local_68[0] = -0x80;
  local_68[1] = 0x7f;
  local_68[2] = -0x8000;
  local_68[3] = 0x7fff;
  local_68[4] = -0x80000000;
  local_68[5] = 0x7fffffff;
  dVar4 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_78,dVar4 ^ 0x324);
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  uVar9 = (ulong)*(uint *)((long)&(pSVar3->varType).m_data + 4);
  iVar5 = glu::getDataTypeScalarSize(dataType);
  __s = *values;
  if (dataType - TYPE_FLOAT < 4) {
    if (iVar5 != 0) {
      sVar8 = (long)iVar5 * 4;
      sVar6 = 0;
      do {
        *(undefined4 *)((long)__s + sVar6) = 0x3f800000;
        sVar6 = sVar6 + 4;
      } while (sVar8 != sVar6);
      if (iVar5 != 0) {
        sVar6 = 0;
        do {
          *(undefined4 *)((long)__s + sVar6) = 0xbf800000;
          sVar6 = sVar6 + 4;
        } while (sVar8 != sVar6);
        if (iVar5 != 0) {
          memset(__s,0,sVar8);
        }
      }
    }
    uVar7 = (numValues + -3) * iVar5;
    if (0 < (int)uVar7) {
      fVar1 = local_48[uVar9 * 2];
      fVar2 = local_48[uVar9 * 2 + 1];
      uVar9 = 0;
      do {
        fVar10 = deRandom_getFloat(&local_78);
        *(float *)((long)__s + uVar9 * 4 + (long)(iVar5 * 3) * 4) = fVar10 * (fVar2 - fVar1) + fVar1
        ;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
  }
  else {
    if (iVar5 != 0) {
      sVar8 = (long)iVar5 * 4;
      sVar6 = 0;
      do {
        *(undefined4 *)((long)__s + sVar6) = 1;
        sVar6 = sVar6 + 4;
      } while (sVar8 != sVar6);
      if (iVar5 != 0) {
        memset(__s,0xff,sVar8);
        memset(__s,0,sVar8);
      }
    }
    fillRandomScalars<int>
              ((Random *)&local_78,local_68[uVar9 * 2],local_68[uVar9 * 2 + 1],
               (void *)((long)__s + (long)(iVar5 * 3) * 4),(numValues + -3) * iVar5,in_R9D);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 floatRanges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e4f,		1e4f),	// mediump	- note: may end up as inf
			Vec2(-1e8f,		1e8f)	// highp	- note: may end up as inf
		};
		const IVec2 intRanges[] =
		{
			IVec2(-(1<<7),		(1<<7)-1),
			IVec2(-(1<<15),		(1<<15)-1),
			IVec2(0x80000000,	0x7fffffff)
		};

		de::Random				rnd			(deStringHash(m_name) ^ 0x324u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Special cases.
			std::fill((float*)values[0], (float*)values[0] + scalarSize, +1.0f);
			std::fill((float*)values[0], (float*)values[0] + scalarSize, -1.0f);
			std::fill((float*)values[0], (float*)values[0] + scalarSize,  0.0f);
			fillRandomScalars(rnd, floatRanges[precision].x(), floatRanges[precision].y(), (float*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
		else
		{
			std::fill((int*)values[0], (int*)values[0] + scalarSize, +1);
			std::fill((int*)values[0], (int*)values[0] + scalarSize, -1);
			std::fill((int*)values[0], (int*)values[0] + scalarSize,  0);
			fillRandomScalars(rnd, intRanges[precision].x(), intRanges[precision].y(), (int*)values[0] + scalarSize*3, (numValues-3)*scalarSize);
		}
	}